

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode output_auth_headers(connectdata *conn,auth *authstatus,char *request,char *path,_Bool proxy
                            )

{
  uint uVar1;
  Curl_easy *data;
  Curl_easy *data_00;
  CURLcode CVar2;
  long lVar3;
  unsigned_long uVar4;
  char *pcVar5;
  size_t insize;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  char **ppcVar9;
  char *local_48;
  long local_40;
  size_t size;
  
  data = conn->data;
  uVar4 = authstatus->picked;
  if (uVar4 == 1) {
    uVar1 = *(uint *)&(conn->bits).field_0x4;
    if (proxy) {
      if (((uVar1 >> 8 & 1) != 0) &&
         (pcVar8 = Curl_checkProxyheaders(conn,"Proxy-authorization"), pcVar8 == (char *)0x0)) {
        local_40 = 0x408;
        lVar3 = 0x180;
        lVar6 = 0x188;
        goto LAB_003be2c6;
      }
LAB_003be1b4:
      pcVar8 = (char *)0x0;
    }
    else {
      if ((-1 < (char)uVar1) ||
         (pcVar8 = Curl_checkheaders(conn,"Authorization"), pcVar8 != (char *)0x0))
      goto LAB_003be1b4;
      local_40 = 0x420;
      lVar3 = 0x210;
      lVar6 = 0x218;
LAB_003be2c6:
      size = 0;
      local_48 = (char *)0x0;
      data_00 = conn->data;
      pcVar8 = curl_maprintf("%s:%s",*(undefined8 *)((conn->chunk).hexbuffer + lVar3 + -0x20),
                             *(undefined8 *)((conn->chunk).hexbuffer + lVar6 + -0x20));
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      insize = strlen(pcVar8);
      CVar2 = Curl_base64_encode(data_00,pcVar8,insize,&local_48,&size);
      lVar3 = local_40;
      if (CVar2 == CURLE_OK) {
        if (local_48 == (char *)0x0) {
          CVar2 = CURLE_REMOTE_ACCESS_DENIED;
        }
        else {
          (*Curl_cfree)(*(void **)((conn->chunk).hexbuffer + local_40 + -0x20));
          pcVar5 = "";
          if (proxy) {
            pcVar5 = "Proxy-";
          }
          pcVar5 = curl_maprintf("%sAuthorization: Basic %s\r\n",pcVar5,local_48);
          *(char **)((conn->chunk).hexbuffer + lVar3 + -0x20) = pcVar5;
          (*Curl_cfree)(local_48);
          CVar2 = CURLE_OUT_OF_MEMORY;
          if (*(long *)((conn->chunk).hexbuffer + lVar3 + -0x20) != 0) {
            CVar2 = CURLE_OK;
          }
        }
      }
      (*Curl_cfree)(pcVar8);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      pcVar8 = "Basic";
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  else if (uVar4 == 2) {
    CVar2 = Curl_output_digest(conn,proxy,(uchar *)request,(uchar *)path);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pcVar8 = "Digest";
  }
  else {
    if (uVar4 != 8) {
      pcVar8 = (char *)0x0;
      goto LAB_003be1c8;
    }
    CVar2 = Curl_output_ntlm(conn,proxy);
    if (CVar2 != CURLE_OK) {
      return CVar2;
    }
    pcVar8 = "NTLM";
  }
  uVar4 = authstatus->picked;
LAB_003be1c8:
  if (uVar4 == 0x40) {
    if (((!proxy) && (conn->oauth_bearer != (char *)0x0)) &&
       (pcVar5 = Curl_checkheaders(conn,"Authorization:"), pcVar5 == (char *)0x0)) {
      (*Curl_cfree)((conn->allocptr).userpwd);
      pcVar8 = curl_maprintf("Authorization: Bearer %s\r\n",conn->oauth_bearer);
      (conn->allocptr).userpwd = pcVar8;
      if (pcVar8 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar8 = "Bearer";
    }
    authstatus->field_0x18 = authstatus->field_0x18 | 1;
  }
  if (pcVar8 == (char *)0x0) {
    authstatus->field_0x18 = authstatus->field_0x18 & 0xfd;
  }
  else {
    pcVar5 = "Server";
    ppcVar9 = &conn->user;
    if (proxy) {
      pcVar5 = "Proxy";
      ppcVar9 = &(conn->http_proxy).user;
    }
    pcVar7 = "";
    if (*ppcVar9 != (char *)0x0) {
      pcVar7 = *ppcVar9;
    }
    Curl_infof(data,"%s auth using %s with user \'%s\'\n",pcVar5,pcVar8,pcVar7);
    authstatus->field_0x18 =
         (authstatus->field_0x18 & 0xfd | authstatus->field_0x18 * '\x02' & 2U) ^ 2;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode
output_auth_headers(struct connectdata *conn,
                    struct auth *authstatus,
                    const char *request,
                    const char *path,
                    bool proxy)
{
  const char *auth = NULL;
  CURLcode result = CURLE_OK;
#if !defined(CURL_DISABLE_VERBOSE_STRINGS) || defined(USE_SPNEGO)
  struct Curl_easy *data = conn->data;
#endif

#ifdef CURL_DISABLE_CRYPTO_AUTH
  (void)request;
  (void)path;
#endif

#ifdef USE_SPNEGO
  if((authstatus->picked == CURLAUTH_NEGOTIATE)) {
    auth = "Negotiate";
    result = Curl_output_negotiate(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifdef USE_NTLM
  if(authstatus->picked == CURLAUTH_NTLM) {
    auth = "NTLM";
    result = Curl_output_ntlm(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#if defined(USE_NTLM) && defined(NTLM_WB_ENABLED)
  if(authstatus->picked == CURLAUTH_NTLM_WB) {
    auth = "NTLM_WB";
    result = Curl_output_ntlm_wb(conn, proxy);
    if(result)
      return result;
  }
  else
#endif
#ifndef CURL_DISABLE_CRYPTO_AUTH
  if(authstatus->picked == CURLAUTH_DIGEST) {
    auth = "Digest";
    result = Curl_output_digest(conn,
                                proxy,
                                (const unsigned char *)request,
                                (const unsigned char *)path);
    if(result)
      return result;
  }
  else
#endif
  if(authstatus->picked == CURLAUTH_BASIC) {
    /* Basic */
    if((proxy && conn->bits.proxy_user_passwd &&
        !Curl_checkProxyheaders(conn, "Proxy-authorization")) ||
       (!proxy && conn->bits.user_passwd &&
        !Curl_checkheaders(conn, "Authorization"))) {
      auth = "Basic";
      result = http_output_basic(conn, proxy);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }
  if(authstatus->picked == CURLAUTH_BEARER) {
    /* Bearer */
    if((!proxy && conn->oauth_bearer &&
        !Curl_checkheaders(conn, "Authorization:"))) {
      auth = "Bearer";
      result = http_output_bearer(conn);
      if(result)
        return result;
    }

    /* NOTE: this function should set 'done' TRUE, as the other auth
       functions work that way */
    authstatus->done = TRUE;
  }

  if(auth) {
    infof(data, "%s auth using %s with user '%s'\n",
          proxy ? "Proxy" : "Server", auth,
          proxy ? (conn->http_proxy.user ? conn->http_proxy.user : "") :
                  (conn->user ? conn->user : ""));
    authstatus->multipass = (!authstatus->done) ? TRUE : FALSE;
  }
  else
    authstatus->multipass = FALSE;

  return CURLE_OK;
}